

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<double>::growTo(vec<double> *this,uint size,double *pad)

{
  double dVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (this->sz < size) {
    reserve(this,size);
    auVar4 = _DAT_001d4970;
    auVar3 = _DAT_001d4960;
    uVar5 = (ulong)this->sz;
    if (this->sz < size) {
      pdVar2 = this->data;
      dVar1 = *pad;
      lVar7 = (size - uVar5) + -1;
      auVar8._8_4_ = (int)lVar7;
      auVar8._0_8_ = lVar7;
      auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_001d4970;
      do {
        auVar9._8_4_ = (int)uVar6;
        auVar9._0_8_ = uVar6;
        auVar9._12_4_ = (int)(uVar6 >> 0x20);
        auVar9 = (auVar9 | auVar3) ^ auVar4;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          pdVar2[uVar5 + uVar6] = dVar1;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          pdVar2[uVar5 + uVar6 + 1] = dVar1;
        }
        uVar6 = uVar6 + 2;
      } while (((size - uVar5) + 1 & 0xfffffffffffffffe) != uVar6);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}